

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime_data.cpp
# Opt level: O3

void __thiscall
ximu::DateTimeData::DateTimeData
          (DateTimeData *this,size_t year,size_t month,size_t day,size_t hours,size_t minutes,
          size_t seconds)

{
  size_t in_stack_00000008;
  
  this->_year = year;
  this->_month = month;
  this->_day = day;
  this->_hours = hours;
  this->_minutes = minutes;
  this->_seconds = in_stack_00000008;
  return;
}

Assistant:

DateTimeData::DateTimeData(size_t year, size_t month, size_t day,
               size_t hours, size_t minutes, size_t seconds)
    :
    _year(year),
    _month(month),
    _day(day),
    _hours(hours),
    _minutes(minutes),
    _seconds(seconds) {
}